

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddFocusEvent(ImGuiIO *this,bool focused)

{
  undefined1 local_38 [8];
  ImGuiInputEvent e;
  ImGuiContext *g;
  bool focused_local;
  ImGuiIO *this_local;
  
  e._16_8_ = GImGui;
  if (&GImGui->IO != this) {
    __assert_fail("&g.IO == this && \"Can only add events to current context.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x596,"void ImGuiIO::AddFocusEvent(bool)");
  }
  ImGuiInputEvent::ImGuiInputEvent((ImGuiInputEvent *)local_38);
  local_38._0_4_ = ImGuiInputEventType_Focus;
  e.Type._0_1_ = focused;
  ImVector<ImGuiInputEvent>::push_back
            ((ImVector<ImGuiInputEvent> *)(e._16_8_ + 0x38e8),(ImGuiInputEvent *)local_38);
  return;
}

Assistant:

void ImGuiIO::AddFocusEvent(bool focused)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_Focus;
    e.AppFocused.Focused = focused;
    g.InputEventsQueue.push_back(e);
}